

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_tree(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  uint uVar159;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing tree : 146 of 172 functions ...\n");
  }
  iVar1 = test_xmlAddChild();
  iVar2 = test_xmlAddChildList();
  iVar3 = test_xmlAddNextSibling();
  iVar4 = test_xmlAddPrevSibling();
  iVar5 = test_xmlAddSibling();
  iVar6 = test_xmlAttrSerializeTxtContent();
  iVar7 = test_xmlBufContent();
  iVar8 = test_xmlBufEnd();
  iVar9 = test_xmlBufGetNodeContent();
  iVar10 = test_xmlBufNodeDump();
  iVar11 = test_xmlBufShrink();
  iVar12 = test_xmlBufUse();
  iVar13 = test_xmlBufferAdd();
  iVar14 = test_xmlBufferAddHead();
  iVar15 = test_xmlBufferCCat();
  iVar16 = test_xmlBufferCat();
  iVar17 = test_xmlBufferContent();
  iVar18 = test_xmlBufferCreate();
  iVar19 = test_xmlBufferCreateSize();
  iVar20 = test_xmlBufferCreateStatic();
  iVar21 = test_xmlBufferDetach();
  iVar22 = test_xmlBufferEmpty();
  iVar23 = test_xmlBufferGrow();
  iVar24 = test_xmlBufferLength();
  iVar25 = test_xmlBufferResize();
  iVar26 = test_xmlBufferSetAllocationScheme();
  iVar27 = test_xmlBufferShrink();
  iVar28 = test_xmlBufferWriteCHAR();
  iVar29 = test_xmlBufferWriteChar();
  iVar30 = test_xmlBufferWriteQuotedString();
  iVar31 = test_xmlBuildQName();
  iVar32 = test_xmlChildElementCount();
  iVar33 = test_xmlCopyDoc();
  iVar34 = test_xmlCopyDtd();
  iVar35 = test_xmlCopyNamespace();
  iVar36 = test_xmlCopyNamespaceList();
  iVar37 = test_xmlCopyNode();
  iVar38 = test_xmlCopyNodeList();
  iVar39 = test_xmlCopyProp();
  iVar40 = test_xmlCopyPropList();
  iVar41 = test_xmlCreateIntSubset();
  iVar42 = test_xmlDOMWrapAdoptNode();
  iVar43 = test_xmlDOMWrapCloneNode();
  iVar44 = test_xmlDOMWrapNewCtxt();
  iVar45 = test_xmlDOMWrapReconcileNamespaces();
  iVar46 = test_xmlDOMWrapRemoveNode();
  iVar47 = test_xmlDeregisterNodeDefault();
  iVar48 = test_xmlDocCopyNode();
  iVar49 = test_xmlDocCopyNodeList();
  iVar50 = test_xmlDocDump();
  iVar51 = test_xmlDocDumpFormatMemory();
  iVar52 = test_xmlDocDumpFormatMemoryEnc();
  iVar53 = test_xmlDocDumpMemory();
  iVar54 = test_xmlDocDumpMemoryEnc();
  iVar55 = test_xmlDocFormatDump();
  iVar56 = test_xmlDocGetRootElement();
  iVar57 = test_xmlDocSetRootElement();
  iVar58 = test_xmlElemDump();
  iVar59 = test_xmlFirstElementChild();
  iVar60 = test_xmlGetBufferAllocationScheme();
  iVar61 = test_xmlGetCompressMode();
  iVar62 = test_xmlGetDocCompressMode();
  iVar63 = test_xmlGetIntSubset();
  iVar64 = test_xmlGetLastChild();
  iVar65 = test_xmlGetLineNo();
  iVar66 = test_xmlGetNoNsProp();
  iVar67 = test_xmlGetNodePath();
  iVar68 = test_xmlGetNsList();
  iVar69 = test_xmlGetNsListSafe();
  iVar70 = test_xmlGetNsProp();
  iVar71 = test_xmlGetProp();
  iVar72 = test_xmlHasNsProp();
  iVar73 = test_xmlHasProp();
  iVar74 = test_xmlIsBlankNode();
  iVar75 = test_xmlIsXHTML();
  iVar76 = test_xmlLastElementChild();
  iVar77 = test_xmlNewCDataBlock();
  iVar78 = test_xmlNewCharRef();
  iVar79 = test_xmlNewChild();
  iVar80 = test_xmlNewComment();
  iVar81 = test_xmlNewDoc();
  iVar82 = test_xmlNewDocComment();
  iVar83 = test_xmlNewDocFragment();
  iVar84 = test_xmlNewDocNode();
  iVar85 = test_xmlNewDocNodeEatName();
  iVar86 = test_xmlNewDocPI();
  iVar87 = test_xmlNewDocProp();
  iVar88 = test_xmlNewDocRawNode();
  iVar89 = test_xmlNewDocText();
  iVar90 = test_xmlNewDocTextLen();
  iVar91 = test_xmlNewDtd();
  iVar92 = test_xmlNewNode();
  iVar93 = test_xmlNewNodeEatName();
  iVar94 = test_xmlNewNs();
  iVar95 = test_xmlNewNsProp();
  iVar96 = test_xmlNewNsPropEatName();
  iVar97 = test_xmlNewPI();
  iVar98 = test_xmlNewProp();
  iVar99 = test_xmlNewReference();
  iVar100 = test_xmlNewText();
  iVar101 = test_xmlNewTextChild();
  iVar102 = test_xmlNewTextLen();
  iVar103 = test_xmlNextElementSibling();
  iVar104 = test_xmlNodeAddContent();
  iVar105 = test_xmlNodeAddContentLen();
  iVar106 = test_xmlNodeBufGetContent();
  iVar107 = test_xmlNodeDump();
  iVar108 = test_xmlNodeDumpOutput();
  iVar109 = test_xmlNodeGetAttrValue();
  iVar110 = test_xmlNodeGetBase();
  iVar111 = test_xmlNodeGetBaseSafe();
  iVar112 = test_xmlNodeGetContent();
  iVar113 = test_xmlNodeGetLang();
  iVar114 = test_xmlNodeGetSpacePreserve();
  iVar115 = test_xmlNodeIsText();
  iVar116 = test_xmlNodeListGetRawString();
  iVar117 = test_xmlNodeListGetString();
  iVar118 = test_xmlNodeSetBase();
  iVar119 = test_xmlNodeSetContent();
  iVar120 = test_xmlNodeSetContentLen();
  iVar121 = test_xmlNodeSetLang();
  iVar122 = test_xmlNodeSetName();
  iVar123 = test_xmlNodeSetSpacePreserve();
  iVar124 = test_xmlPreviousElementSibling();
  iVar125 = test_xmlReconciliateNs();
  iVar126 = test_xmlRegisterNodeDefault();
  iVar127 = test_xmlRemoveProp();
  iVar128 = test_xmlReplaceNode();
  iVar129 = test_xmlSaveFile();
  iVar130 = test_xmlSaveFileEnc();
  iVar131 = test_xmlSaveFileTo();
  iVar132 = test_xmlSaveFormatFile();
  iVar133 = test_xmlSaveFormatFileEnc();
  iVar134 = test_xmlSaveFormatFileTo();
  iVar135 = test_xmlSearchNs();
  iVar136 = test_xmlSearchNsByHref();
  iVar137 = test_xmlSetBufferAllocationScheme();
  iVar138 = test_xmlSetCompressMode();
  iVar139 = test_xmlSetDocCompressMode();
  iVar140 = test_xmlSetNs();
  iVar141 = test_xmlSetNsProp();
  iVar142 = test_xmlSetProp();
  iVar143 = test_xmlSplitQName2();
  iVar144 = test_xmlSplitQName3();
  iVar145 = test_xmlStringGetNodeList();
  iVar146 = test_xmlStringLenGetNodeList();
  iVar147 = test_xmlTextConcat();
  iVar148 = test_xmlTextMerge();
  iVar149 = test_xmlThrDefBufferAllocScheme();
  iVar150 = test_xmlThrDefDefaultBufferSize();
  iVar151 = test_xmlThrDefDeregisterNodeDefault();
  iVar152 = test_xmlThrDefRegisterNodeDefault();
  iVar153 = test_xmlUnsetNsProp();
  iVar154 = test_xmlUnsetProp();
  iVar155 = test_xmlValidateNCName();
  iVar156 = test_xmlValidateNMToken();
  iVar157 = test_xmlValidateName();
  iVar158 = test_xmlValidateQName();
  uVar159 = iVar158 + iVar157 + iVar156 + iVar155 + iVar154 + iVar153 + iVar152 + iVar151 + iVar150 
                                                  + iVar149 + iVar148 + iVar147 + iVar146 + iVar145 
                                                  + iVar144 + iVar143 + iVar142 + iVar141 + iVar140 
                                                  + iVar139 + iVar138 + iVar137 + iVar136 + iVar135 
                                                  + iVar134 + iVar133 + iVar132 + iVar131 + iVar130 
                                                  + iVar129 + iVar128 + iVar127 + iVar126 + iVar125 
                                                  + iVar124 + iVar123 + iVar122 + iVar121 + iVar120 
                                                  + iVar119 + iVar118 + iVar117 + iVar116 + iVar115 
                                                  + iVar114 + iVar113 + iVar112 + iVar111 + iVar110 
                                                  + iVar109 + iVar108 + iVar107 + iVar106 + iVar105 
                                                  + iVar104 + iVar103 + iVar102 + iVar101 + iVar100 
                                                  + iVar99 + iVar98 + iVar97 + iVar96 + iVar95 + 
                                                  iVar94 + iVar93 + iVar92 + iVar91 + iVar90 + 
                                                  iVar89 + iVar88 + iVar87 + iVar86 + iVar85 + 
                                                  iVar84 + iVar83 + iVar82 + iVar81 + iVar80 + 
                                                  iVar79 + iVar78 + iVar77 + iVar76 + iVar75 + 
                                                  iVar74 + iVar73 + iVar72 + iVar71 + iVar70 + 
                                                  iVar69 + iVar68 + iVar67 + iVar66 + iVar65 + 
                                                  iVar64 + iVar63 + iVar62 + iVar61 + iVar60 + 
                                                  iVar59 + iVar58 + iVar57 + iVar56 + iVar55 + 
                                                  iVar54 + iVar53 + iVar52 + iVar51 + iVar50 + 
                                                  iVar49 + iVar48 + iVar47 + iVar46 + iVar45 + 
                                                  iVar44 + iVar43 + iVar42 + iVar41 + iVar40 + 
                                                  iVar39 + iVar38 + iVar37 + iVar36 + iVar35 + 
                                                  iVar34 + iVar33 + iVar32 + iVar31 + iVar30 + 
                                                  iVar29 + iVar28 + iVar27 + iVar26 + iVar25 + 
                                                  iVar24 + iVar23 + iVar22 + iVar21 + iVar20 + 
                                                  iVar19 + iVar18 + iVar17 + iVar16 + iVar15 + 
                                                  iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9
                                                                                               + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar159 != 0) {
    printf("Module tree: %d errors\n",(ulong)uVar159);
  }
  return uVar159;
}

Assistant:

static int
test_tree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing tree : 146 of 172 functions ...\n");
    test_ret += test_xmlAddChild();
    test_ret += test_xmlAddChildList();
    test_ret += test_xmlAddNextSibling();
    test_ret += test_xmlAddPrevSibling();
    test_ret += test_xmlAddSibling();
    test_ret += test_xmlAttrSerializeTxtContent();
    test_ret += test_xmlBufContent();
    test_ret += test_xmlBufEnd();
    test_ret += test_xmlBufGetNodeContent();
    test_ret += test_xmlBufNodeDump();
    test_ret += test_xmlBufShrink();
    test_ret += test_xmlBufUse();
    test_ret += test_xmlBufferAdd();
    test_ret += test_xmlBufferAddHead();
    test_ret += test_xmlBufferCCat();
    test_ret += test_xmlBufferCat();
    test_ret += test_xmlBufferContent();
    test_ret += test_xmlBufferCreate();
    test_ret += test_xmlBufferCreateSize();
    test_ret += test_xmlBufferCreateStatic();
    test_ret += test_xmlBufferDetach();
    test_ret += test_xmlBufferEmpty();
    test_ret += test_xmlBufferGrow();
    test_ret += test_xmlBufferLength();
    test_ret += test_xmlBufferResize();
    test_ret += test_xmlBufferSetAllocationScheme();
    test_ret += test_xmlBufferShrink();
    test_ret += test_xmlBufferWriteCHAR();
    test_ret += test_xmlBufferWriteChar();
    test_ret += test_xmlBufferWriteQuotedString();
    test_ret += test_xmlBuildQName();
    test_ret += test_xmlChildElementCount();
    test_ret += test_xmlCopyDoc();
    test_ret += test_xmlCopyDtd();
    test_ret += test_xmlCopyNamespace();
    test_ret += test_xmlCopyNamespaceList();
    test_ret += test_xmlCopyNode();
    test_ret += test_xmlCopyNodeList();
    test_ret += test_xmlCopyProp();
    test_ret += test_xmlCopyPropList();
    test_ret += test_xmlCreateIntSubset();
    test_ret += test_xmlDOMWrapAdoptNode();
    test_ret += test_xmlDOMWrapCloneNode();
    test_ret += test_xmlDOMWrapNewCtxt();
    test_ret += test_xmlDOMWrapReconcileNamespaces();
    test_ret += test_xmlDOMWrapRemoveNode();
    test_ret += test_xmlDeregisterNodeDefault();
    test_ret += test_xmlDocCopyNode();
    test_ret += test_xmlDocCopyNodeList();
    test_ret += test_xmlDocDump();
    test_ret += test_xmlDocDumpFormatMemory();
    test_ret += test_xmlDocDumpFormatMemoryEnc();
    test_ret += test_xmlDocDumpMemory();
    test_ret += test_xmlDocDumpMemoryEnc();
    test_ret += test_xmlDocFormatDump();
    test_ret += test_xmlDocGetRootElement();
    test_ret += test_xmlDocSetRootElement();
    test_ret += test_xmlElemDump();
    test_ret += test_xmlFirstElementChild();
    test_ret += test_xmlGetBufferAllocationScheme();
    test_ret += test_xmlGetCompressMode();
    test_ret += test_xmlGetDocCompressMode();
    test_ret += test_xmlGetIntSubset();
    test_ret += test_xmlGetLastChild();
    test_ret += test_xmlGetLineNo();
    test_ret += test_xmlGetNoNsProp();
    test_ret += test_xmlGetNodePath();
    test_ret += test_xmlGetNsList();
    test_ret += test_xmlGetNsListSafe();
    test_ret += test_xmlGetNsProp();
    test_ret += test_xmlGetProp();
    test_ret += test_xmlHasNsProp();
    test_ret += test_xmlHasProp();
    test_ret += test_xmlIsBlankNode();
    test_ret += test_xmlIsXHTML();
    test_ret += test_xmlLastElementChild();
    test_ret += test_xmlNewCDataBlock();
    test_ret += test_xmlNewCharRef();
    test_ret += test_xmlNewChild();
    test_ret += test_xmlNewComment();
    test_ret += test_xmlNewDoc();
    test_ret += test_xmlNewDocComment();
    test_ret += test_xmlNewDocFragment();
    test_ret += test_xmlNewDocNode();
    test_ret += test_xmlNewDocNodeEatName();
    test_ret += test_xmlNewDocPI();
    test_ret += test_xmlNewDocProp();
    test_ret += test_xmlNewDocRawNode();
    test_ret += test_xmlNewDocText();
    test_ret += test_xmlNewDocTextLen();
    test_ret += test_xmlNewDtd();
    test_ret += test_xmlNewNode();
    test_ret += test_xmlNewNodeEatName();
    test_ret += test_xmlNewNs();
    test_ret += test_xmlNewNsProp();
    test_ret += test_xmlNewNsPropEatName();
    test_ret += test_xmlNewPI();
    test_ret += test_xmlNewProp();
    test_ret += test_xmlNewReference();
    test_ret += test_xmlNewText();
    test_ret += test_xmlNewTextChild();
    test_ret += test_xmlNewTextLen();
    test_ret += test_xmlNextElementSibling();
    test_ret += test_xmlNodeAddContent();
    test_ret += test_xmlNodeAddContentLen();
    test_ret += test_xmlNodeBufGetContent();
    test_ret += test_xmlNodeDump();
    test_ret += test_xmlNodeDumpOutput();
    test_ret += test_xmlNodeGetAttrValue();
    test_ret += test_xmlNodeGetBase();
    test_ret += test_xmlNodeGetBaseSafe();
    test_ret += test_xmlNodeGetContent();
    test_ret += test_xmlNodeGetLang();
    test_ret += test_xmlNodeGetSpacePreserve();
    test_ret += test_xmlNodeIsText();
    test_ret += test_xmlNodeListGetRawString();
    test_ret += test_xmlNodeListGetString();
    test_ret += test_xmlNodeSetBase();
    test_ret += test_xmlNodeSetContent();
    test_ret += test_xmlNodeSetContentLen();
    test_ret += test_xmlNodeSetLang();
    test_ret += test_xmlNodeSetName();
    test_ret += test_xmlNodeSetSpacePreserve();
    test_ret += test_xmlPreviousElementSibling();
    test_ret += test_xmlReconciliateNs();
    test_ret += test_xmlRegisterNodeDefault();
    test_ret += test_xmlRemoveProp();
    test_ret += test_xmlReplaceNode();
    test_ret += test_xmlSaveFile();
    test_ret += test_xmlSaveFileEnc();
    test_ret += test_xmlSaveFileTo();
    test_ret += test_xmlSaveFormatFile();
    test_ret += test_xmlSaveFormatFileEnc();
    test_ret += test_xmlSaveFormatFileTo();
    test_ret += test_xmlSearchNs();
    test_ret += test_xmlSearchNsByHref();
    test_ret += test_xmlSetBufferAllocationScheme();
    test_ret += test_xmlSetCompressMode();
    test_ret += test_xmlSetDocCompressMode();
    test_ret += test_xmlSetNs();
    test_ret += test_xmlSetNsProp();
    test_ret += test_xmlSetProp();
    test_ret += test_xmlSplitQName2();
    test_ret += test_xmlSplitQName3();
    test_ret += test_xmlStringGetNodeList();
    test_ret += test_xmlStringLenGetNodeList();
    test_ret += test_xmlTextConcat();
    test_ret += test_xmlTextMerge();
    test_ret += test_xmlThrDefBufferAllocScheme();
    test_ret += test_xmlThrDefDefaultBufferSize();
    test_ret += test_xmlThrDefDeregisterNodeDefault();
    test_ret += test_xmlThrDefRegisterNodeDefault();
    test_ret += test_xmlUnsetNsProp();
    test_ret += test_xmlUnsetProp();
    test_ret += test_xmlValidateNCName();
    test_ret += test_xmlValidateNMToken();
    test_ret += test_xmlValidateName();
    test_ret += test_xmlValidateQName();

    if (test_ret != 0)
	printf("Module tree: %d errors\n", test_ret);
    return(test_ret);
}